

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

_Bool finalize_p2sh_wrapped(wally_psbt_input *input)

{
  int iVar1;
  size_t local_30;
  size_t push_len;
  size_t script_len;
  uchar *script;
  wally_psbt_input *input_local;
  
  script = (uchar *)input;
  push_len = script_get_push_size(input->redeem_script_len);
  script_len = (size_t)wally_malloc(push_len);
  if (((uchar *)script_len != (uchar *)0x0) &&
     (iVar1 = wally_script_push_from_bytes
                        (*(uchar **)(script + 0x10),*(size_t *)(script + 0x18),0,(uchar *)script_len
                         ,push_len,&local_30), iVar1 == 0)) {
    *(size_t *)(script + 0x30) = script_len;
    *(size_t *)(script + 0x38) = local_30;
    return true;
  }
  wally_free((void *)script_len);
  wally_tx_witness_stack_free(*(wally_tx_witness_stack **)(script + 0x40));
  script[0x40] = '\0';
  script[0x41] = '\0';
  script[0x42] = '\0';
  script[0x43] = '\0';
  script[0x44] = '\0';
  script[0x45] = '\0';
  script[0x46] = '\0';
  script[0x47] = '\0';
  return false;
}

Assistant:

static bool finalize_p2sh_wrapped(struct wally_psbt_input *input)
{
    unsigned char *script;
    size_t script_len, push_len;

    /* P2SH wrapped witness: add scriptSig pushing the redeemScript */
    script_len = script_get_push_size(input->redeem_script_len);
    if ((script = wally_malloc(script_len)) != NULL &&
        wally_script_push_from_bytes(input->redeem_script,
                                     input->redeem_script_len, 0,
                                     script, script_len,
                                     &push_len) == WALLY_OK) {
        input->final_scriptsig = script;
        input->final_scriptsig_len = push_len;
        return true;
    }
    /* Failed: clear caller-created witness stack before returning */
    wally_free(script);
    wally_tx_witness_stack_free(input->final_witness);
    input->final_witness = NULL;
    return false;
}